

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_stroke_line(nk_command_buffer *b,float x0,float y0,float x1,float y1,float line_thickness,
                   nk_color c)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  if (b != (nk_command_buffer *)0x0) {
    if (0.0 < line_thickness) {
      pvVar1 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar1 != (void *)0x0) {
        auVar2._0_4_ = (uint)line_thickness;
        auVar2._4_4_ = (int)x0;
        auVar2._8_4_ = (int)y0;
        auVar2._12_4_ = (int)x1;
        auVar3 = packssdw(auVar2,auVar2);
        *(ulong *)((long)pvVar1 + 0x10) =
             auVar3._0_8_ & 0xffffffffffff0000 | (ulong)auVar2._0_4_ & 0xffff;
        *(short *)((long)pvVar1 + 0x18) = (short)(int)y1;
        *(nk_color *)((long)pvVar1 + 0x1a) = c;
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x221e,
                "void nk_stroke_line(struct nk_command_buffer *, float, float, float, float, float, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_stroke_line(struct nk_command_buffer *b, float x0, float y0,
    float x1, float y1, float line_thickness, struct nk_color c)
{
    struct nk_command_line *cmd;
    NK_ASSERT(b);
    if (!b || line_thickness <= 0) return;
    cmd = (struct nk_command_line*)
        nk_command_buffer_push(b, NK_COMMAND_LINE, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->begin.x = (short)x0;
    cmd->begin.y = (short)y0;
    cmd->end.x = (short)x1;
    cmd->end.y = (short)y1;
    cmd->color = c;
}